

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O0

void __thiscall
test_adjacency_graph_resize_undirected_Test::TestBody
          (test_adjacency_graph_resize_undirected_Test *this)

{
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph;
  bool bVar1;
  char *pcVar2;
  reference peVar3;
  AssertHelper local_510;
  Message local_508;
  int local_4fc;
  size_t local_4f8;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar_14;
  Message local_4d8;
  int local_4cc;
  size_t local_4c8;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_13;
  AssertHelper local_4a8;
  Message local_4a0;
  int local_494;
  size_t local_490;
  span<unsigned_long,_18446744073709551615UL> local_488;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_12;
  Message local_460;
  int local_454;
  size_t local_450;
  span<unsigned_long,_18446744073709551615UL> local_448;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_11;
  Message local_420;
  int local_414;
  size_t local_410;
  span<unsigned_long,_18446744073709551615UL> local_408;
  size_type local_3f8;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_10;
  Message local_3d8;
  int local_3cc;
  size_t local_3c8;
  span<unsigned_long,_18446744073709551615UL> local_3c0;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_9;
  Message local_398;
  int local_38c;
  size_t local_388;
  span<unsigned_long,_18446744073709551615UL> local_380;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_8;
  Message local_358;
  int local_34c;
  size_t local_348;
  span<unsigned_long,_18446744073709551615UL> local_340;
  size_type local_330;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_7;
  Message local_310;
  int local_304;
  size_t local_300;
  span<unsigned_long,_18446744073709551615UL> local_2f8;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_6;
  Message local_2d0;
  int local_2c4;
  size_t local_2c0;
  span<unsigned_long,_18446744073709551615UL> local_2b8;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_5;
  Message local_290;
  int local_284;
  size_t local_280;
  span<unsigned_long,_18446744073709551615UL> local_278;
  size_type local_268;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_4;
  Message local_248;
  int local_23c;
  size_t local_238;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_3;
  Message local_218;
  int local_20c;
  size_t local_208;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_2;
  int local_1e8 [20];
  pair<unsigned_long,_unsigned_long> local_198;
  pair<unsigned_long,_unsigned_long> local_188;
  pair<unsigned_long,_unsigned_long> local_178;
  pair<unsigned_long,_unsigned_long> local_168;
  pair<unsigned_long,_unsigned_long> local_158;
  pair<unsigned_long,_unsigned_long> local_148;
  pair<unsigned_long,_unsigned_long> local_138;
  pair<unsigned_long,_unsigned_long> local_128;
  pair<unsigned_long,_unsigned_long> local_118;
  pair<unsigned_long,_unsigned_long> local_108;
  iterator local_f8;
  undefined8 local_f0;
  Adjacency_Graph<true> local_e8;
  AssertHelper local_b8;
  Message local_b0;
  int local_a4;
  size_t local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80;
  int local_74;
  size_t local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  size_t local_48;
  Adjacency_Graph<false> local_40 [8];
  Adjacency_Graph<true> graph;
  test_adjacency_graph_resize_undirected_Test *this_local;
  
  graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Disa::Adjacency_Graph<false>::Adjacency_Graph(local_40);
  local_48 = 5;
  Disa::Adjacency_Graph<false>::resize(local_40,&local_48);
  local_70 = Disa::Adjacency_Graph<false>::size_edge(local_40);
  local_74 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_68,"graph.size_edge()","0",&local_70,&local_74);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1ca,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_a0 = Disa::Adjacency_Graph<false>::size_vertex(local_40);
  local_a4 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_98,"graph.size_vertex()","5",&local_a0,&local_a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1cb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_1e8[0x13] = 0;
  local_1e8[0x12] = 1;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_198,local_1e8 + 0x13,local_1e8 + 0x12);
  local_1e8[0x11] = 1;
  local_1e8[0x10] = 2;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_188,local_1e8 + 0x11,local_1e8 + 0x10);
  local_1e8[0xf] = 2;
  local_1e8[0xe] = 3;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_178,local_1e8 + 0xf,local_1e8 + 0xe);
  local_1e8[0xd] = 3;
  local_1e8[0xc] = 4;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_168,local_1e8 + 0xd,local_1e8 + 0xc);
  local_1e8[0xb] = 0;
  local_1e8[10] = 4;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_158,local_1e8 + 0xb,local_1e8 + 10);
  local_1e8[9] = 0;
  local_1e8[8] = 2;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_148,local_1e8 + 9,local_1e8 + 8);
  local_1e8[7] = 0;
  local_1e8[6] = 3;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_138,local_1e8 + 7,local_1e8 + 6);
  local_1e8[5] = 1;
  local_1e8[4] = 3;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_128,local_1e8 + 5,local_1e8 + 4);
  local_1e8[3] = 1;
  local_1e8[2] = 4;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_118,local_1e8 + 3,local_1e8 + 2);
  local_1e8[1] = 2;
  local_1e8[0] = 4;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_108,local_1e8 + 1,local_1e8);
  local_f8 = &local_198;
  local_f0 = 10;
  edge_graph._M_len = 10;
  edge_graph._M_array = local_f8;
  Disa::Adjacency_Graph<false>::Adjacency_Graph((Adjacency_Graph<false> *)&local_e8,edge_graph);
  Disa::Adjacency_Graph<false>::operator=(local_40,&local_e8);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph((Adjacency_Graph<false> *)&local_e8);
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3;
  Disa::Adjacency_Graph<false>::resize(local_40,(size_t *)&gtest_ar_2.message_);
  local_208 = Disa::Adjacency_Graph<false>::size_edge(local_40);
  local_20c = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_200,"graph.size_edge()","3",&local_208,&local_20c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1d1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  local_238 = Disa::Adjacency_Graph<false>::size_vertex(local_40);
  local_23c = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_230,"graph.size_vertex()","3",&local_238,&local_23c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1d2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  local_280 = 0;
  local_278 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_280);
  local_268 = std::span<unsigned_long,_18446744073709551615UL>::size(&local_278);
  local_284 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_260,"graph[0].size()","2",&local_268,&local_284);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1d3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  local_2c0 = 0;
  local_2b8 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_2c0);
  peVar3 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_2b8,0);
  local_2c4 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2a8,"graph[0][0]","1",peVar3,&local_2c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1d4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  local_300 = 0;
  local_2f8 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_300);
  peVar3 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_2f8,1);
  local_304 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2e8,"graph[0][1]","2",peVar3,&local_304);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1d5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  local_348 = 1;
  local_340 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_348);
  local_330 = std::span<unsigned_long,_18446744073709551615UL>::size(&local_340);
  local_34c = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_328,"graph[1].size()","2",&local_330,&local_34c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1d6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  local_388 = 1;
  local_380 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_388);
  peVar3 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_380,0);
  local_38c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_370,"graph[1][0]","0",peVar3,&local_38c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1d7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  local_3c8 = 1;
  local_3c0 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_3c8);
  peVar3 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_3c0,1);
  local_3cc = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3b0,"graph[1][1]","2",peVar3,&local_3cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1d8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  local_410 = 2;
  local_408 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_410);
  local_3f8 = std::span<unsigned_long,_18446744073709551615UL>::size(&local_408);
  local_414 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3f0,"graph[2].size()","2",&local_3f8,&local_414);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_420);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1d9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  local_450 = 2;
  local_448 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_450);
  peVar3 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_448,0);
  local_454 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_438,"graph[2][0]","0",peVar3,&local_454);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1da,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_460);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  local_490 = 2;
  local_488 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_490);
  peVar3 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_488,1);
  local_494 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_478,"graph[2][1]","1",peVar3,&local_494);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_4a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              (&local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1db,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_4a8);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  gtest_ar_13.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  Disa::Adjacency_Graph<false>::resize(local_40,(size_t *)&gtest_ar_13.message_);
  local_4c8 = Disa::Adjacency_Graph<false>::size_edge(local_40);
  local_4cc = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_4c0,"graph.size_edge()","0",&local_4c8,&local_4cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_4d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1df,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_4d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  local_4f8 = Disa::Adjacency_Graph<false>::size_vertex(local_40);
  local_4fc = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_4f0,"graph.size_vertex()","0",&local_4f8,&local_4fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f0);
  if (!bVar1) {
    testing::Message::Message(&local_508);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_510,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1e0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_510,&local_508);
    testing::internal::AssertHelper::~AssertHelper(&local_510);
    testing::Message::~Message(&local_508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(local_40);
  return;
}

Assistant:

TEST(test_adjacency_graph, resize_undirected) {

  // Test sizing up.
  Adjacency_Graph<false> graph;
  graph.resize(5);
  EXPECT_EQ(graph.size_edge(), 0);
  EXPECT_EQ(graph.size_vertex(), 5);

  // Test size down, start with a fully connected pentagon graph.
  graph = Adjacency_Graph<false>({{0, 1}, {1, 2}, {2, 3}, {3, 4}, {0, 4}, {0, 2}, {0, 3}, {1, 3}, {1, 4}, {2, 4}});

  graph.resize(3);  // get rid of all two vertices - it's now a 2-simplex.
  EXPECT_EQ(graph.size_edge(), 3);
  EXPECT_EQ(graph.size_vertex(), 3);
  EXPECT_EQ(graph[0].size(), 2);
  EXPECT_EQ(graph[0][0], 1);
  EXPECT_EQ(graph[0][1], 2);
  EXPECT_EQ(graph[1].size(), 2);
  EXPECT_EQ(graph[1][0], 0);
  EXPECT_EQ(graph[1][1], 2);
  EXPECT_EQ(graph[2].size(), 2);
  EXPECT_EQ(graph[2][0], 0);
  EXPECT_EQ(graph[2][1], 1);

  // check zero sizing.
  graph.resize(0);
  EXPECT_EQ(graph.size_edge(), 0);
  EXPECT_EQ(graph.size_vertex(), 0);
}